

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_button_pop_behavior(nk_context *ctx)

{
  nk_config_stack_button_behavior *pnVar1;
  nk_config_stack_button_behavior_element *pnVar2;
  int iVar3;
  nk_config_stack_button_behavior_element *element;
  nk_config_stack_button_behavior *button_stack;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4e86,"int nk_button_pop_behavior(struct nk_context *)");
  }
  if (ctx == (nk_context *)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    pnVar1 = &(ctx->stacks).button_behaviors;
    if (pnVar1->head < 1) {
      __assert_fail("button_stack->head > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x4e8a,"int nk_button_pop_behavior(struct nk_context *)");
    }
    if (pnVar1->head < 1) {
      ctx_local._4_4_ = 0;
    }
    else {
      iVar3 = pnVar1->head + -1;
      pnVar1->head = iVar3;
      pnVar2 = (ctx->stacks).button_behaviors.elements + iVar3;
      *pnVar2->address = pnVar2->old_value;
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_button_pop_behavior(struct nk_context *ctx)
{
    struct nk_config_stack_button_behavior *button_stack;
    struct nk_config_stack_button_behavior_element *element;

    NK_ASSERT(ctx);
    if (!ctx) return 0;

    button_stack = &ctx->stacks.button_behaviors;
    NK_ASSERT(button_stack->head > 0);
    if (button_stack->head < 1)
        return 0;

    element = &button_stack->elements[--button_stack->head];
    *element->address = element->old_value;
    return 1;
}